

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

bool __thiscall gl4cts::GLSL420Pack::APITestBase::testCompute(APITestBase *this)

{
  undefined1 uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  char *__filename;
  program *ppVar3;
  program program;
  shaderSource compute_shader;
  shaderSource local_218;
  shaderSource local_1f8;
  shaderSource local_1d8;
  shaderSource local_1b8;
  MessageBuilder message;
  
  ppVar3 = &program;
  program.m_context = (this->super_TestBase).super_TestCase.m_context;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  compute_shader.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  compute_shader.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  compute_shader.m_parts.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __filename = (char *)0x0;
  TestBase::initShaderSource(&this->super_TestBase,COMPUTE_SHADER,false,&compute_shader);
  if (((compute_shader.m_parts.
        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
        ._M_impl.super__Vector_impl_data._M_start)->m_code)._M_string_length == 0) {
    uVar1 = 1;
  }
  else {
    message.m_log = (TestLog *)0x0;
    message.m_str.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)0x0;
    message.m_str.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
    local_1b8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1d8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f8.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_218.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.m_parts.
    super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Utils::program::build
              (&program,&compute_shader,(shaderSource *)&message,&local_1b8,&local_1d8,&local_1f8,
               &local_218,(GLchar **)0x0,0,false);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector(&local_218.m_parts);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector(&local_1f8.m_parts);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector(&local_1d8.m_parts);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector(&local_1b8.m_parts);
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::~vector((vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
               *)&message);
    iVar2 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1680))(program.m_program_object_id);
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x47c9);
    iVar2 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
              [0xc])(this);
    uVar1 = (undefined1)iVar2;
    __filename = (char *)ppVar3;
  }
  std::
  vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
  ::~vector(&compute_shader.m_parts);
  Utils::program::remove(&program,__filename);
  return (bool)uVar1;
}

Assistant:

bool APITestBase::testCompute()
{
	/* GL objects */
	Utils::program program(m_context);

	/* Shaders */
	Utils::shaderSource compute_shader;
	initShaderSource(Utils::COMPUTE_SHADER, false, compute_shader);

	/* Check if test support compute shaders */
	if (true == compute_shader.m_parts[0].m_code.empty())
	{
		return true;
	}

	/* Build program */
	try
	{
		program.build(compute_shader, 0 /* fragment shader */, 0 /* geometry shader */,
					  0 /* tesselation control shader */, 0 /* tesselation evaluation shader */, 0 /* vertex shader */,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Something wrong with compilation, test case failed */
		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Shader compilation failed. Error message: " << exc.m_error_message;

		Utils::program::printShaderSource(exc.m_shader_source, message);

		message << tcu::TestLog::EndMessage;

		return false;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return false;
	}

	/* Set current program */
	program.use();

	/* Return result of verification */
	return checkResults(program);
}